

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFDocument.cpp
# Opt level: O2

bool __thiscall iDynTree::URDFDocument::documentHasBeenParsed(URDFDocument *this)

{
  Model *this_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::MaterialElement::MaterialInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::MaterialElement::MaterialInfo>_>_>
  *materialDatabase;
  pointer psVar1;
  element_type *peVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  iterator iVar10;
  ostream *poVar11;
  SensorsList *pSVar12;
  undefined4 extraout_var;
  Sensor *pSVar13;
  SensorType *pSVar14;
  ulong uVar15;
  long *plVar16;
  Transform *pTVar17;
  ModelSolidShapes *pMVar18;
  size_t root;
  __node_base *p_Var19;
  pointer psVar20;
  long lVar21;
  uint uVar22;
  int local_554;
  URDFDocument *local_550;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rootCandidates;
  string err_1;
  string err;
  shared_ptr<iDynTree::RevoluteJoint> revolute;
  string baseLinkName;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  childLinks;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  shared_ptr<iDynTree::PrismaticJoint> prismatic;
  Model normalizedModel;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3a0 [37];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258 [32];
  string local_238 [32];
  Model newModel;
  ostream local_208 [376];
  Transform local_90 [96];
  
  this_00 = &this->m_model;
  childLinks._M_h._M_buckets = &childLinks._M_h._M_single_bucket;
  childLinks._M_h._M_bucket_count = 1;
  childLinks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  childLinks._M_h._M_element_count = 0;
  childLinks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  childLinks._M_h._M_rehash_policy._M_next_resize = 0;
  childLinks._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var19 = &(this->m_buffers).joints._M_h._M_before_begin;
  local_550 = this;
  while (p_Var19 = p_Var19->_M_nxt, p_Var19 != (__node_base *)0x0) {
    std::__cxx11::string::string((string *)&newModel,(string *)(p_Var19 + 1));
    std::__shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2> *)&normalizedModel,
               (__shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2> *)(p_Var19 + 5));
    uVar7 = iDynTree::Model::getLinkIndex((string *)this_00);
    uVar8 = iDynTree::Model::getLinkIndex((string *)this_00);
    (**(code **)(*(long *)_normalizedModel + 0x28))(_normalizedModel,uVar7,uVar8);
    std::dynamic_pointer_cast<iDynTree::RevoluteJoint,iDynTree::IJoint>
              ((shared_ptr<iDynTree::IJoint> *)&revolute);
    if (revolute.super___shared_ptr<iDynTree::RevoluteJoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::dynamic_pointer_cast<iDynTree::PrismaticJoint,iDynTree::IJoint>
                ((shared_ptr<iDynTree::IJoint> *)&prismatic);
      if (prismatic.super___shared_ptr<iDynTree::PrismaticJoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (element_type *)0x0) {
        iDynTree::reportError("URDFDocument","processJoints","Unrecognized joint type");
      }
      else {
        (**(code **)(*(long *)prismatic.
                              super___shared_ptr<iDynTree::PrismaticJoint,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 0x128))
                  (prismatic.
                   super___shared_ptr<iDynTree::PrismaticJoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   p_Var19 + 7,uVar8,uVar7);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&prismatic.super___shared_ptr<iDynTree::PrismaticJoint,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    else {
      (**(code **)(*(long *)revolute.
                            super___shared_ptr<iDynTree::RevoluteJoint,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 0x128))
                (revolute.super___shared_ptr<iDynTree::RevoluteJoint,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,p_Var19 + 7,uVar8,uVar7);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&revolute.super___shared_ptr<iDynTree::RevoluteJoint,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    iDynTree::Model::addJoint((string *)this_00,(IJoint *)&newModel);
    std::__detail::
    _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&childLinks,(value_type *)(p_Var19 + 0x11));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_3a0);
    std::__cxx11::string::~string((string *)&newModel);
  }
  p_Var19 = &(local_550->m_buffers).fixedJoints._M_h._M_before_begin;
  while (p_Var19 = p_Var19->_M_nxt, p_Var19 != (__node_base *)0x0) {
    std::__cxx11::string::string((string *)&newModel,(string *)(p_Var19 + 1));
    std::__shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2> *)&normalizedModel,
               (__shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2> *)(p_Var19 + 5));
    uVar7 = iDynTree::Model::getLinkIndex((string *)this_00);
    uVar8 = iDynTree::Model::getLinkIndex((string *)this_00);
    (**(code **)(*(long *)_normalizedModel + 0x28))(_normalizedModel,uVar7,uVar8);
    iDynTree::Model::addJoint((string *)this_00,(IJoint *)&newModel);
    std::__detail::
    _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&childLinks,(value_type *)(p_Var19 + 0x11));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_3a0);
    std::__cxx11::string::~string((string *)&newModel);
  }
  rootCandidates.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rootCandidates.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  rootCandidates.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar22 = 0; uVar9 = iDynTree::Model::getNrOfLinks(), uVar22 < uVar9; uVar22 = uVar22 + 1) {
    iDynTree::Model::getLinkName_abi_cxx11_((long)&newModel);
    iVar10 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::find(&childLinks._M_h,(key_type *)&newModel);
    if (iVar10.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&rootCandidates,(key_type *)&newModel);
    }
    std::__cxx11::string::~string((string *)&newModel);
  }
  if (rootCandidates.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      rootCandidates.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iDynTree::reportError("RobotElement","exitElementScope","No root link found in URDF string");
    iDynTree::Model::Model(&newModel);
    iDynTree::Model::operator=(this_00,&newModel);
    iDynTree::Model::~Model(&newModel);
  }
  else {
    if ((ulong)((long)rootCandidates.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)rootCandidates.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      iDynTree::Model::getLinkIndex((string *)this_00);
      iDynTree::Model::setDefaultBaseLink((long)this_00);
      iDynTree::Model::Model(&newModel);
      iDynTree::Model::Model(&normalizedModel);
      iDynTree::Model::getPackageDirs_abi_cxx11_();
      iDynTree::Model::setPackageDirs((vector *)&newModel);
      iDynTree::Model::getPackageDirs_abi_cxx11_();
      iDynTree::Model::setPackageDirs((vector *)&normalizedModel);
      cVar3 = iDynTree::removeFakeLinks(this_00,&newModel);
      if (cVar3 == '\0') {
        iDynTree::reportError
                  ("URDFDocument","documentHasBeenParsed",
                   "Failed to remove fake links from the model");
        bVar4 = false;
      }
      else {
        iDynTree::Model::getDefaultBaseLink();
        iDynTree::Model::getLinkName_abi_cxx11_((long)&baseLinkName);
        cVar3 = iDynTree::createModelWithNormalizedJointNumbering
                          (&newModel,(string *)&baseLinkName,&normalizedModel);
        if (cVar3 == '\0') {
          iDynTree::reportError
                    ("URDFDocument","documentHasBeenParsed",
                     "Failed to remove fake links from the model");
LAB_00137566:
          bVar4 = false;
        }
        else {
          iDynTree::Model::operator=(this_00,&normalizedModel);
          iDynTree::SensorsList::SensorsList((SensorsList *)&revolute);
          pSVar12 = (SensorsList *)iDynTree::Model::sensors();
          iDynTree::SensorsList::operator=(pSVar12,(SensorsList *)&revolute);
          iDynTree::SensorsList::~SensorsList((SensorsList *)&revolute);
          psVar1 = (local_550->m_buffers).sensorHelpers.
                   super__Vector_base<std::shared_ptr<iDynTree::SensorHelper>,_std::allocator<std::shared_ptr<iDynTree::SensorHelper>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (psVar20 = (local_550->m_buffers).sensorHelpers.
                         super__Vector_base<std::shared_ptr<iDynTree::SensorHelper>,_std::allocator<std::shared_ptr<iDynTree::SensorHelper>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; psVar20 != psVar1;
              psVar20 = psVar20 + 1) {
            peVar2 = (psVar20->
                     super___shared_ptr<iDynTree::SensorHelper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            iVar6 = (*peVar2->_vptr_SensorHelper[2])(peVar2,this_00);
            plVar16 = (long *)CONCAT44(extraout_var,iVar6);
            if (plVar16 == (long *)0x0) {
              iDynTree::SensorsList::SensorsList((SensorsList *)&revolute);
              pSVar12 = (SensorsList *)iDynTree::Model::sensors();
              iDynTree::SensorsList::operator=(pSVar12,(SensorsList *)&revolute);
              iDynTree::SensorsList::~SensorsList((SensorsList *)&revolute);
              goto LAB_00137566;
            }
            pSVar13 = (Sensor *)iDynTree::Model::sensors();
            iDynTree::SensorsList::addSensor(pSVar13);
            (**(code **)(*plVar16 + 8))(plVar16);
          }
          if ((local_550->m_options).addSensorFramesAsAdditionalFrames == true) {
            bVar4 = true;
            for (local_554 = 0; local_554 < 5; local_554 = local_554 + 1) {
              if (local_554 - 1U < 4) {
                uVar9 = 0;
                while( true ) {
                  pSVar14 = (SensorType *)iDynTree::Model::sensors();
                  uVar15 = iDynTree::SensorsList::getNrOfSensors(pSVar14);
                  if (uVar15 <= uVar9) break;
                  pSVar14 = (SensorType *)iDynTree::Model::sensors();
                  lVar21 = iDynTree::SensorsList::getSensor(pSVar14,(long)&local_554);
                  if ((lVar21 == 0) ||
                     (plVar16 = (long *)__dynamic_cast(lVar21,&Sensor::typeinfo,
                                                       &LinkSensor::typeinfo,0),
                     plVar16 == (long *)0x0)) goto LAB_00137566;
                  (**(code **)(*plVar16 + 0x50))(plVar16);
                  iDynTree::Model::getLinkName_abi_cxx11_((long)&prismatic);
                  (**(code **)(*plVar16 + 0x10))(local_238,plVar16);
                  cVar3 = iDynTree::Model::isFrameNameUsed(this_00,local_238);
                  std::__cxx11::string::~string(local_238);
                  if (cVar3 == '\0') {
                    (**(code **)(*plVar16 + 0x10))(&err,plVar16);
                    (**(code **)(*plVar16 + 0x58))(&revolute,plVar16);
                    cVar3 = iDynTree::Model::addAdditionalFrameToLink(this_00,&prismatic,&err);
                    std::__cxx11::string::~string((string *)&err);
                    if (cVar3 == '\0') {
                      (**(code **)(*plVar16 + 0x10))(&local_428,plVar16);
                      std::operator+(&err_1,
                                     "addSensorFramesAsAdditionalFrames is specified as an option, but it is impossible to add the frame of sensor "
                                     ,&local_428);
                      std::operator+(&err,&err_1," for unknown reasons");
                      std::__cxx11::string::~string((string *)&err_1);
                      std::__cxx11::string::~string((string *)&local_428);
                      iDynTree::reportError
                                ("","addSensorFramesAsAdditionalFramesToModel",err._M_dataplus._M_p)
                      ;
                      std::__cxx11::string::~string((string *)&err);
                      bVar4 = false;
                    }
                  }
                  std::__cxx11::string::~string((string *)&prismatic);
                  uVar9 = uVar9 + 1;
                }
              }
              if (local_554 == 0) {
                uVar9 = 0;
                while( true ) {
                  pSVar14 = (SensorType *)iDynTree::Model::sensors();
                  uVar15 = iDynTree::SensorsList::getNrOfSensors(pSVar14);
                  if (uVar15 <= uVar9) break;
                  pSVar14 = (SensorType *)iDynTree::Model::sensors();
                  uVar7 = iDynTree::SensorsList::getSensor(pSVar14,(long)&local_554);
                  plVar16 = (long *)__dynamic_cast(uVar7,&Sensor::typeinfo,
                                                   &SixAxisForceTorqueSensor::typeinfo,0);
                  iDynTree::SixAxisForceTorqueSensor::getSecondLinkName_abi_cxx11_();
                  (**(code **)(*plVar16 + 0x10))(local_258,plVar16);
                  cVar3 = iDynTree::Model::isFrameNameUsed(this_00,local_258);
                  std::__cxx11::string::~string(local_258);
                  if (cVar3 == '\0') {
                    iDynTree::Transform::Transform((Transform *)&prismatic);
                    pTVar17 = (Transform *)iDynTree::SixAxisForceTorqueSensor::getSecondLinkIndex();
                    cVar3 = iDynTree::SixAxisForceTorqueSensor::getLinkSensorTransform
                                      ((long)plVar16,pTVar17);
                    if (cVar3 != '\0') {
                      (**(code **)(*plVar16 + 0x10))(&err_1,plVar16);
                      iDynTree::Transform::Transform(local_90,(Transform *)&prismatic);
                      cVar3 = iDynTree::Model::addAdditionalFrameToLink(this_00,&err,&err_1);
                      std::__cxx11::string::~string((string *)&err_1);
                      if (cVar3 != '\0') goto LAB_00137514;
                    }
                    (**(code **)(*plVar16 + 0x10))(&local_278,plVar16);
                    std::operator+(&local_428,
                                   "addSensorFramesAsAdditionalFrames is specified as an option, but it is impossible to add the frame of sensor "
                                   ,&local_278);
                    std::operator+(&err_1,&local_428," for unknown reasons");
                    std::__cxx11::string::~string((string *)&local_428);
                    std::__cxx11::string::~string((string *)&local_278);
                    iDynTree::reportError
                              ("","addSensorFramesAsAdditionalFramesToModel",err_1._M_dataplus._M_p)
                    ;
                    std::__cxx11::string::~string((string *)&err_1);
                    bVar4 = false;
                  }
LAB_00137514:
                  std::__cxx11::string::~string((string *)&err);
                  uVar9 = uVar9 + 1;
                }
              }
            }
            if (!bVar4) goto LAB_00137566;
          }
          pMVar18 = (ModelSolidShapes *)iDynTree::Model::visualSolidShapes();
          materialDatabase = &(local_550->m_buffers).materials;
          bVar4 = addVisualPropertiesToModel
                            (this_00,&(local_550->m_buffers).visuals,materialDatabase,pMVar18);
          if (!bVar4) {
            iDynTree::reportError
                      ("URDFDocument","documentHasBeenParsed",
                       "Failed to add visual elements to model");
          }
          pMVar18 = (ModelSolidShapes *)iDynTree::Model::collisionSolidShapes();
          bVar5 = addVisualPropertiesToModel
                            (this_00,&(local_550->m_buffers).collisions,materialDatabase,pMVar18);
          bVar4 = true;
          if (!bVar5) {
            iDynTree::reportError
                      ("URDFDocument","documentHasBeenParsed",
                       "Failed to add collision elements to model");
          }
        }
        std::__cxx11::string::~string((string *)&baseLinkName);
      }
      iDynTree::Model::~Model(&normalizedModel);
      iDynTree::Model::~Model(&newModel);
      goto LAB_0013758f;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&newModel);
    poVar11 = std::operator<<(local_208,"Multiple (");
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    std::operator<<(poVar11,") root links: (");
    std::operator<<(local_208,
                    (string *)
                    rootCandidates.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    lVar21 = 0x20;
    for (uVar9 = 1;
        uVar9 < (ulong)((long)rootCandidates.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)rootCandidates.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar9 = uVar9 + 1) {
      poVar11 = std::operator<<(local_208,", ");
      std::operator<<(poVar11,(string *)
                              ((long)&((rootCandidates.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar21));
      lVar21 = lVar21 + 0x20;
    }
    std::operator<<(local_208,") found in URDF string");
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("RobotElement","exitElementScope",(char *)_normalizedModel);
    std::__cxx11::string::~string((string *)&normalizedModel);
    iDynTree::Model::Model(&normalizedModel);
    iDynTree::Model::operator=(this_00,&normalizedModel);
    iDynTree::Model::~Model(&normalizedModel);
    std::__cxx11::stringstream::~stringstream((stringstream *)&newModel);
  }
  bVar4 = false;
LAB_0013758f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&rootCandidates);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&childLinks._M_h);
  return bVar4;
}

Assistant:

bool URDFDocument::documentHasBeenParsed()
    {
        // Maybe it is not the cleanest solution to process the model here,
        // but the after the scope is exited, the Model should be fully formed.
        // Add the joints to the model
        std::unordered_set<std::string> childLinks = processJoints(m_model,
                                                                   m_buffers.joints,
                                                                   m_buffers.fixedJoints);
        // Get root
        std::vector<std::string> rootCandidates;
        for(unsigned link = 0; link < m_model.getNrOfLinks(); ++link)
        {
            std::string linkName = m_model.getLinkName(link);
            if (childLinks.find(linkName) == childLinks.end() )
            {
                rootCandidates.push_back(linkName);
            }
        }

        if (rootCandidates.empty()) {
            reportError("RobotElement", "exitElementScope", "No root link found in URDF string");
            m_model = Model();
            return false;
        }

        if (rootCandidates.size() >= 2) {
            std::stringstream ss;
            ss << "Multiple (" << rootCandidates.size() << ") root links: (";
            ss << rootCandidates[0];
            for (size_t root = 1; root < rootCandidates.size(); ++root)
            {
                ss << ", " << rootCandidates[root];
            }
            ss << ") found in URDF string";

            reportError("RobotElement", "exitElementScope", ss.str().c_str());
            m_model = Model();
            return false;
        }

        // set the default root in the model
        m_model.setDefaultBaseLink(m_model.getLinkIndex(rootCandidates[0]));
        iDynTree::Model newModel, normalizedModel;
        newModel.setPackageDirs(m_model.getPackageDirs());
        normalizedModel.setPackageDirs(m_model.getPackageDirs());

        if (!removeFakeLinks(m_model, newModel)) {
            reportError("URDFDocument", "documentHasBeenParsed", "Failed to remove fake links from the model");
            return false;
        }

        std::string baseLinkName = newModel.getLinkName(newModel.getDefaultBaseLink());
        if (!createModelWithNormalizedJointNumbering(newModel, baseLinkName, normalizedModel)) {
            reportError("URDFDocument", "documentHasBeenParsed", "Failed to remove fake links from the model");
            return false;
        }

        m_model = normalizedModel;

        if (!processSensors(m_model, m_buffers.sensorHelpers))
        {
            //TODO: error
            return false;
        }

        if (m_options.addSensorFramesAsAdditionalFrames)
        {
            if (!addSensorFramesAsAdditionalFramesToModel(m_model)) {
                //TODO: error
                return false;
            }
        }

        // Assign visual properties to objects
        if (!addVisualPropertiesToModel(m_model,
                                        m_buffers.visuals,
                                        m_buffers.materials,
                                        m_model.visualSolidShapes())) {
            reportError("URDFDocument", "documentHasBeenParsed", "Failed to add visual elements to model");
        }
        if (!addVisualPropertiesToModel(m_model,
                                        m_buffers.collisions,
                                        m_buffers.materials,
                                        m_model.collisionSolidShapes())) {
            reportError("URDFDocument", "documentHasBeenParsed", "Failed to add collision elements to model");
        }

        return true;
    }